

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O3

void __thiscall
bdNodeManager::ConnectionAuth
          (bdNodeManager *this,bdId *srcId,bdId *proxyId,bdId *destId,uint32_t mode,uint32_t loc,
          uint32_t bandwidth,uint32_t delay,uint32_t answer)

{
  bdConnectManager *this_00;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"bdNodeManager::ConnectionAuth()",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  this_00 = (this->super_bdNode).mConnMgr;
  if (answer != 0) {
    bdConnectManager::AuthConnectionNo(this_00,srcId,proxyId,destId,mode,loc,answer);
    return;
  }
  bdConnectManager::AuthConnectionOk(this_00,srcId,proxyId,destId,mode,loc,bandwidth,delay);
  return;
}

Assistant:

void bdNodeManager::ConnectionAuth(bdId *srcId, bdId *proxyId, bdId *destId, uint32_t mode, uint32_t loc, uint32_t bandwidth, uint32_t delay, uint32_t answer) {
	std::cerr << "bdNodeManager::ConnectionAuth()";
	std::cerr << std::endl;

	if (answer == BITDHT_CONNECT_ANSWER_OKAY)
		mConnMgr->AuthConnectionOk(srcId, proxyId, destId, mode, loc, bandwidth, delay);
	else
		mConnMgr->AuthConnectionNo(srcId, proxyId, destId, mode, loc, answer);
}